

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  fpclass_type fVar8;
  int32_t iVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int32_t iVar24;
  fpclass_type fVar25;
  int32_t iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  fpclass_type *pfVar34;
  int start_00;
  ulong uVar35;
  uint uVar36;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  uint uVar43;
  ulong uVar44;
  type t;
  uint local_434;
  cpp_dec_float<50U,_int,_void> local_380;
  long local_348;
  long local_340;
  IdxElement local_338;
  IdxElement local_2fc;
  IdxElement local_2c0;
  IdxElement local_284;
  IdxElement local_248;
  IdxElement local_20c;
  cpp_dec_float<50U,_int,_void> local_1d0;
  IdxElement local_198;
  IdxElement local_15c;
  IdxElement local_120;
  IdxElement local_e4;
  IdxElement local_a8;
  IdxElement local_6c;
  ulong uVar37;
  
  uVar35 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar36 = end - 1;
    uVar37 = (ulong)uVar36;
    uVar31 = uVar36 - start;
    if (0x18 < (int)uVar31) {
LAB_00297b4b:
      start_00 = (int)uVar35;
      iVar32 = (uVar31 >> 1) + start_00;
      pIVar1 = keys + iVar32;
      pIVar2 = keys + iVar32;
      pnVar30 = &pIVar2->val;
      iVar32 = pIVar2->idx;
      uVar11 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
      uVar13 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
      uVar14 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
      uVar15 = *(undefined8 *)(pnVar30->m_backend).data._M_elems;
      uVar16 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
      iVar7 = (pIVar2->val).m_backend.exp;
      bVar5 = (pIVar2->val).m_backend.neg;
      fVar8 = (pIVar2->val).m_backend.fpclass;
      iVar9 = (pIVar2->val).m_backend.prec_elem;
      lVar29 = (long)start_00;
      uVar36 = (uint)uVar37;
      local_348 = (long)(int)uVar36;
      local_340 = -local_348;
      uVar38 = uVar35;
      uVar44 = uVar37;
      do {
        iVar28 = (int)uVar38;
        iVar42 = (int)uVar44;
        uVar39 = uVar38;
        if ((type & 1U) == 0) {
          if (iVar28 < (int)uVar36) {
            pfVar34 = &keys[iVar28].val.m_backend.fpclass;
            do {
              local_e4.idx = pfVar34[-0xd];
              local_e4.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar34 + -4);
              local_e4.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<50U,_int,_void> *)(pfVar34 + -0xc))->data)._M_elems;
              local_e4.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar34 + -10);
              local_e4.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar34 + -8);
              local_e4.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar34 + -6);
              local_e4.val.m_backend.exp = pfVar34[-2];
              local_e4.val.m_backend.neg = *(bool *)(pfVar34 + -1);
              local_e4.val.m_backend._48_8_ = *(undefined8 *)pfVar34;
              local_284.idx = iVar32;
              local_284.val.m_backend.data._M_elems._0_8_ = uVar15;
              local_284.val.m_backend.data._M_elems._8_8_ = uVar16;
              local_284.val.m_backend.data._M_elems._16_8_ = uVar13;
              local_284.val.m_backend.data._M_elems._24_8_ = uVar14;
              local_284.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_284.val.m_backend.exp = iVar7;
              local_284.val.m_backend.neg = bVar5;
              local_284.val.m_backend.fpclass = fVar8;
              local_284.val.m_backend.prec_elem = iVar9;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_380,compare,&local_e4,&local_284);
              uVar39 = uVar38;
              if (local_380.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1d0,0,(type *)0x0);
              iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_380,&local_1d0);
              if (0 < iVar28) break;
              uVar31 = (int)uVar38 + 1;
              uVar38 = (ulong)uVar31;
              pfVar34 = pfVar34 + 0xf;
              uVar39 = uVar37;
            } while (uVar36 != uVar31);
          }
          if (start_00 < iVar42) {
            local_434 = (uint)uVar39;
            uVar44 = (ulong)iVar42;
            pfVar34 = &keys[uVar44].val.m_backend.fpclass;
            do {
              local_120.idx = pfVar34[-0xd];
              local_120.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar34 + -4);
              local_120.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<50U,_int,_void> *)(pfVar34 + -0xc))->data)._M_elems;
              local_120.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar34 + -10);
              local_120.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar34 + -8);
              local_120.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar34 + -6);
              local_120.val.m_backend.exp = pfVar34[-2];
              local_120.val.m_backend.neg = *(bool *)(pfVar34 + -1);
              local_120.val.m_backend._48_8_ = *(undefined8 *)pfVar34;
              local_2c0.idx = iVar32;
              local_2c0.val.m_backend.data._M_elems._0_8_ = uVar15;
              local_2c0.val.m_backend.data._M_elems._8_8_ = uVar16;
              local_2c0.val.m_backend.data._M_elems._16_8_ = uVar13;
              local_2c0.val.m_backend.data._M_elems._24_8_ = uVar14;
              local_2c0.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_2c0.val.m_backend.exp = iVar7;
              local_2c0.val.m_backend.neg = bVar5;
              local_2c0.val.m_backend.fpclass = fVar8;
              local_2c0.val.m_backend.prec_elem = iVar9;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_380,compare,&local_120,&local_2c0);
              if (local_380.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1d0,0,(type *)0x0);
              iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_380,&local_1d0);
              if (iVar28 < 1) break;
              uVar44 = uVar44 - 1;
              pfVar34 = pfVar34 + -0xf;
            } while (lVar29 < (long)uVar44);
LAB_00298152:
            uVar39 = (ulong)local_434;
          }
        }
        else {
          if (iVar28 < (int)uVar36) {
            pfVar34 = &keys[iVar28].val.m_backend.fpclass;
            lVar40 = iVar28 + local_340;
            lVar41 = 0;
            do {
              local_6c.idx = pfVar34[-0xd];
              local_6c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar34 + -4);
              local_6c.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<50U,_int,_void> *)(pfVar34 + -0xc))->data)._M_elems;
              local_6c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar34 + -10);
              local_6c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar34 + -8);
              local_6c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar34 + -6);
              local_6c.val.m_backend.exp = pfVar34[-2];
              local_6c.val.m_backend.neg = *(bool *)(pfVar34 + -1);
              local_6c.val.m_backend._48_8_ = *(undefined8 *)pfVar34;
              local_20c.idx = iVar32;
              local_20c.val.m_backend.data._M_elems._0_8_ = uVar15;
              local_20c.val.m_backend.data._M_elems._8_8_ = uVar16;
              local_20c.val.m_backend.data._M_elems._16_8_ = uVar13;
              local_20c.val.m_backend.data._M_elems._24_8_ = uVar14;
              local_20c.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_20c.val.m_backend.exp = iVar7;
              local_20c.val.m_backend.neg = bVar5;
              local_20c.val.m_backend.fpclass = fVar8;
              local_20c.val.m_backend.prec_elem = iVar9;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_380,compare,&local_6c,&local_20c);
              if (local_380.fpclass == cpp_dec_float_NaN) {
                uVar39 = (ulong)(uint)(iVar28 - (int)lVar41);
                break;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1d0,0,(type *)0x0);
              iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_380,&local_1d0);
              if (-1 < iVar27) {
                uVar39 = (ulong)(uint)(iVar28 - (int)lVar41);
                break;
              }
              lVar41 = lVar41 + -1;
              pfVar34 = pfVar34 + 0xf;
              uVar39 = uVar37;
            } while (lVar40 != lVar41);
          }
          if (start_00 < iVar42) {
            local_434 = (uint)uVar39;
            uVar44 = (ulong)iVar42;
            pfVar34 = &keys[uVar44].val.m_backend.fpclass;
            do {
              local_a8.idx = pfVar34[-0xd];
              local_a8.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar34 + -4);
              local_a8.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)
                    (((cpp_dec_float<50U,_int,_void> *)(pfVar34 + -0xc))->data)._M_elems;
              local_a8.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar34 + -10);
              local_a8.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar34 + -8);
              local_a8.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar34 + -6);
              local_a8.val.m_backend.exp = pfVar34[-2];
              local_a8.val.m_backend.neg = *(bool *)(pfVar34 + -1);
              local_a8.val.m_backend._48_8_ = *(undefined8 *)pfVar34;
              local_248.idx = iVar32;
              local_248.val.m_backend.data._M_elems._0_8_ = uVar15;
              local_248.val.m_backend.data._M_elems._8_8_ = uVar16;
              local_248.val.m_backend.data._M_elems._16_8_ = uVar13;
              local_248.val.m_backend.data._M_elems._24_8_ = uVar14;
              local_248.val.m_backend.data._M_elems._32_8_ = uVar11;
              local_248.val.m_backend.exp = iVar7;
              local_248.val.m_backend.neg = bVar5;
              local_248.val.m_backend.fpclass = fVar8;
              local_248.val.m_backend.prec_elem = iVar9;
              SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::IdxCompare::operator()
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_380,compare,&local_a8,&local_248);
              if (local_380.fpclass == cpp_dec_float_NaN) break;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_1d0,0,(type *)0x0);
              iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_380,&local_1d0);
              if (iVar28 < 0) break;
              uVar44 = uVar44 - 1;
              pfVar34 = pfVar34 + -0xf;
            } while (lVar29 < (long)uVar44);
            goto LAB_00298152;
          }
        }
        iVar28 = (int)uVar39;
        iVar42 = (int)uVar44;
        if (iVar42 <= iVar28) goto LAB_00298235;
        iVar27 = keys[iVar28].idx;
        uVar12 = *(undefined8 *)(keys[iVar28].val.m_backend.data._M_elems + 8);
        puVar3 = keys[iVar28].val.m_backend.data._M_elems + 4;
        uVar17 = *(undefined8 *)puVar3;
        uVar18 = *(undefined8 *)(puVar3 + 2);
        uVar19 = *(undefined8 *)keys[iVar28].val.m_backend.data._M_elems;
        uVar20 = *(undefined8 *)(keys[iVar28].val.m_backend.data._M_elems + 2);
        iVar10 = keys[iVar28].val.m_backend.exp;
        bVar6 = keys[iVar28].val.m_backend.neg;
        keys[iVar28].idx = keys[iVar42].idx;
        *(undefined8 *)(keys[iVar28].val.m_backend.data._M_elems + 8) =
             *(undefined8 *)(keys[iVar42].val.m_backend.data._M_elems + 8);
        uVar21 = *(undefined8 *)keys[iVar42].val.m_backend.data._M_elems;
        uVar22 = *(undefined8 *)(keys[iVar42].val.m_backend.data._M_elems + 2);
        puVar3 = keys[iVar42].val.m_backend.data._M_elems + 4;
        uVar23 = *(undefined8 *)(puVar3 + 2);
        puVar4 = keys[iVar28].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar4 = *(undefined8 *)puVar3;
        *(undefined8 *)(puVar4 + 2) = uVar23;
        *(undefined8 *)keys[iVar28].val.m_backend.data._M_elems = uVar21;
        *(undefined8 *)(keys[iVar28].val.m_backend.data._M_elems + 2) = uVar22;
        keys[iVar28].val.m_backend.exp = keys[iVar42].val.m_backend.exp;
        keys[iVar28].val.m_backend.neg = keys[iVar42].val.m_backend.neg;
        keys[iVar42].idx = iVar27;
        *(undefined8 *)keys[iVar42].val.m_backend.data._M_elems = uVar19;
        *(undefined8 *)(keys[iVar42].val.m_backend.data._M_elems + 2) = uVar20;
        puVar3 = keys[iVar42].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar3 = uVar17;
        *(undefined8 *)(puVar3 + 2) = uVar18;
        *(undefined8 *)(keys[iVar42].val.m_backend.data._M_elems + 8) = uVar12;
        keys[iVar42].val.m_backend.exp = iVar10;
        keys[iVar42].val.m_backend.neg = bVar6;
        fVar25 = keys[iVar28].val.m_backend.fpclass;
        iVar26 = keys[iVar28].val.m_backend.prec_elem;
        iVar24 = keys[iVar42].val.m_backend.prec_elem;
        keys[iVar28].val.m_backend.fpclass = keys[iVar42].val.m_backend.fpclass;
        keys[iVar28].val.m_backend.prec_elem = iVar24;
        keys[iVar42].val.m_backend.fpclass = fVar25;
        keys[iVar42].val.m_backend.prec_elem = iVar26;
        uVar38 = (ulong)(iVar28 + 1);
        uVar44 = (ulong)(iVar42 - 1);
      } while( true );
    }
LAB_002986e4:
    if (0 < (int)uVar31) {
      SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,uVar36,compare,start);
    }
  }
  return;
LAB_00298235:
  if ((type & 1U) == 0) {
    if (start_00 < iVar42) {
      uVar44 = (ulong)iVar42;
      pfVar34 = &keys[uVar44].val.m_backend.fpclass;
      do {
        local_198.idx = pfVar34[-0xd];
        local_198.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar34 + -4);
        local_198.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar34 + -0xc))->data)._M_elems;
        local_198.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar34 + -10);
        local_198.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar34 + -8);
        local_198.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar34 + -6);
        local_198.val.m_backend.exp = pfVar34[-2];
        local_198.val.m_backend.neg = *(bool *)(pfVar34 + -1);
        local_198.val.m_backend._48_8_ = *(undefined8 *)pfVar34;
        local_338.idx = iVar32;
        local_338.val.m_backend.data._M_elems._0_8_ = uVar15;
        local_338.val.m_backend.data._M_elems._8_8_ = uVar16;
        local_338.val.m_backend.data._M_elems._16_8_ = uVar13;
        local_338.val.m_backend.data._M_elems._24_8_ = uVar14;
        local_338.val.m_backend.data._M_elems._32_8_ = uVar11;
        local_338.val.m_backend.exp = iVar7;
        local_338.val.m_backend.neg = bVar5;
        local_338.val.m_backend.fpclass = fVar8;
        local_338.val.m_backend.prec_elem = iVar9;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_380,compare,&local_338,&local_198);
        if (local_380.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_1d0,0,(type *)0x0);
        iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_380,&local_1d0);
        if (0 < iVar28) break;
        uVar44 = uVar44 - 1;
        pfVar34 = pfVar34 + -0xf;
      } while (lVar29 < (long)uVar44);
    }
    if ((uint)uVar44 == uVar36) {
      iVar32 = keys[local_348].idx;
      uVar11 = *(undefined8 *)(keys[local_348].val.m_backend.data._M_elems + 8);
      puVar3 = keys[local_348].val.m_backend.data._M_elems + 4;
      uVar13 = *(undefined8 *)puVar3;
      uVar14 = *(undefined8 *)(puVar3 + 2);
      uVar15 = *(undefined8 *)keys[local_348].val.m_backend.data._M_elems;
      uVar16 = *(undefined8 *)(keys[local_348].val.m_backend.data._M_elems + 2);
      iVar7 = keys[local_348].val.m_backend.exp;
      bVar5 = keys[local_348].val.m_backend.neg;
      keys[local_348].idx = pIVar1->idx;
      *(undefined8 *)(keys[local_348].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
      uVar12 = *(undefined8 *)(pnVar30->m_backend).data._M_elems;
      uVar17 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
      uVar18 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
      puVar3 = keys[local_348].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar3 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar3 + 2) = uVar18;
      *(undefined8 *)keys[local_348].val.m_backend.data._M_elems = uVar12;
      *(undefined8 *)(keys[local_348].val.m_backend.data._M_elems + 2) = uVar17;
      keys[local_348].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[local_348].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar32;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8) = uVar11;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4) = uVar13;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6) = uVar14;
      *(undefined8 *)(pnVar30->m_backend).data._M_elems = uVar15;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2) = uVar16;
      (pIVar1->val).m_backend.exp = iVar7;
      (pIVar1->val).m_backend.neg = bVar5;
      fVar8 = keys[local_348].val.m_backend.fpclass;
      iVar24 = keys[local_348].val.m_backend.prec_elem;
      iVar9 = (pIVar1->val).m_backend.prec_elem;
      keys[local_348].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[local_348].val.m_backend.prec_elem = iVar9;
      (pIVar1->val).m_backend.fpclass = fVar8;
      (pIVar1->val).m_backend.prec_elem = iVar24;
      uVar44 = (ulong)(uVar36 - 1);
    }
  }
  else {
    uVar38 = uVar39;
    if (iVar28 < (int)uVar36) {
      pfVar34 = &keys[iVar28].val.m_backend.fpclass;
      do {
        local_15c.idx = pfVar34[-0xd];
        local_15c.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)(pfVar34 + -4);
        local_15c.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(pfVar34 + -0xc))->data)._M_elems;
        local_15c.val.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pfVar34 + -10);
        local_15c.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)(pfVar34 + -8);
        local_15c.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(pfVar34 + -6);
        local_15c.val.m_backend.exp = pfVar34[-2];
        local_15c.val.m_backend.neg = *(bool *)(pfVar34 + -1);
        local_15c.val.m_backend._48_8_ = *(undefined8 *)pfVar34;
        local_2fc.idx = iVar32;
        local_2fc.val.m_backend.data._M_elems._0_8_ = uVar15;
        local_2fc.val.m_backend.data._M_elems._8_8_ = uVar16;
        local_2fc.val.m_backend.data._M_elems._16_8_ = uVar13;
        local_2fc.val.m_backend.data._M_elems._24_8_ = uVar14;
        local_2fc.val.m_backend.data._M_elems._32_8_ = uVar11;
        local_2fc.val.m_backend.exp = iVar7;
        local_2fc.val.m_backend.neg = bVar5;
        local_2fc.val.m_backend.fpclass = fVar8;
        local_2fc.val.m_backend.prec_elem = iVar9;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_380,compare,&local_2fc,&local_15c);
        uVar38 = uVar39;
        if (local_380.fpclass == cpp_dec_float_NaN) break;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_1d0,0,(type *)0x0);
        iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_380,&local_1d0);
        if (iVar28 < 0) break;
        uVar31 = (int)uVar39 + 1;
        uVar39 = (ulong)uVar31;
        pfVar34 = pfVar34 + 0xf;
        uVar38 = uVar37;
      } while (uVar36 != uVar31);
    }
    uVar39 = uVar38;
    if ((int)uVar38 == start_00) {
      iVar32 = keys[lVar29].idx;
      uVar11 = *(undefined8 *)(keys[lVar29].val.m_backend.data._M_elems + 8);
      puVar3 = keys[lVar29].val.m_backend.data._M_elems + 4;
      uVar13 = *(undefined8 *)puVar3;
      uVar14 = *(undefined8 *)(puVar3 + 2);
      uVar15 = *(undefined8 *)keys[lVar29].val.m_backend.data._M_elems;
      uVar16 = *(undefined8 *)(keys[lVar29].val.m_backend.data._M_elems + 2);
      iVar7 = keys[lVar29].val.m_backend.exp;
      bVar5 = keys[lVar29].val.m_backend.neg;
      keys[lVar29].idx = pIVar1->idx;
      *(undefined8 *)(keys[lVar29].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8);
      uVar12 = *(undefined8 *)(pnVar30->m_backend).data._M_elems;
      uVar17 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2);
      uVar18 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6);
      puVar3 = keys[lVar29].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar3 = *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar3 + 2) = uVar18;
      *(undefined8 *)keys[lVar29].val.m_backend.data._M_elems = uVar12;
      *(undefined8 *)(keys[lVar29].val.m_backend.data._M_elems + 2) = uVar17;
      keys[lVar29].val.m_backend.exp = (pIVar1->val).m_backend.exp;
      keys[lVar29].val.m_backend.neg = (pIVar1->val).m_backend.neg;
      pIVar1->idx = iVar32;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 8) = uVar11;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 4) = uVar13;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 6) = uVar14;
      *(undefined8 *)(pnVar30->m_backend).data._M_elems = uVar15;
      *(undefined8 *)((pIVar2->val).m_backend.data._M_elems + 2) = uVar16;
      (pIVar1->val).m_backend.exp = iVar7;
      (pIVar1->val).m_backend.neg = bVar5;
      fVar8 = keys[lVar29].val.m_backend.fpclass;
      iVar24 = keys[lVar29].val.m_backend.prec_elem;
      iVar9 = (pIVar1->val).m_backend.prec_elem;
      keys[lVar29].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
      keys[lVar29].val.m_backend.prec_elem = iVar9;
      (pIVar1->val).m_backend.fpclass = fVar8;
      (pIVar1->val).m_backend.prec_elem = iVar24;
      uVar39 = (ulong)(start_00 + 1);
    }
  }
  uVar43 = (uint)uVar44;
  uVar31 = uVar43 - start_00;
  iVar32 = (int)uVar39;
  uVar33 = uVar36 - iVar32;
  if ((int)uVar33 < (int)uVar31) {
    uVar37 = uVar44 & 0xffffffff;
    uVar39 = uVar35;
    uVar33 = uVar31;
    uVar43 = uVar36;
    start_00 = iVar32;
    if ((int)uVar36 <= iVar32) goto LAB_002986c9;
  }
  else {
    uVar35 = uVar39;
    uVar31 = uVar33;
    if ((int)uVar43 <= start_00) goto LAB_002986c9;
  }
  SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,uVar43 + 1,compare,start_00,(bool)(~type & 1));
  uVar35 = uVar39;
  uVar31 = uVar33;
LAB_002986c9:
  uVar36 = (uint)uVar37;
  start = (int)uVar35;
  type = (bool)(type ^ 1);
  if ((int)uVar31 < 0x19) goto LAB_002986e4;
  goto LAB_00297b4b;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}